

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

LZ4_stream_t * duckdb_lz4::LZ4_initStream(void *buffer,size_t size)

{
  LZ4_stream_t *pLVar1;
  
  if (((ulong)buffer & 7) == 0 && (0x401f < size && buffer != (void *)0x0)) {
    pLVar1 = (LZ4_stream_t *)memset(buffer,0,0x4020);
    return pLVar1;
  }
  return (LZ4_stream_t *)0x0;
}

Assistant:

LZ4_stream_t* LZ4_initStream (void* buffer, size_t size)
{
    DEBUGLOG(5, "LZ4_initStream");
    if (buffer == NULL) { return NULL; }
    if (size < sizeof(LZ4_stream_t)) { return NULL; }
    if (!LZ4_isAligned(buffer, LZ4_stream_t_alignment())) return NULL;
    MEM_INIT(buffer, 0, sizeof(LZ4_stream_t_internal));
    return (LZ4_stream_t*)buffer;
}